

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  IResultCapture *pIVar1;
  string local_30;
  
  MessageInfo::MessageInfo(&this->m_info,&builder->m_info);
  this->m_moved = false;
  ReusableStringStream::str_abi_cxx11_(&local_30,(ReusableStringStream *)builder);
  std::__cxx11::string::operator=((string *)&(this->m_info).message,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pIVar1 = getResultCapture();
  (*pIVar1->_vptr_IResultCapture[10])(pIVar1,this);
  return;
}

Assistant:

ScopedMessage::ScopedMessage(MessageBuilder const &builder) :
        m_info(builder.m_info) {
        m_info.message = builder.m_stream.str();
        getResultCapture().pushScopedMessage(m_info);
    }